

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O3

int VP8LHashChainInit(VP8LHashChain *p,int size)

{
  uint32_t *puVar1;
  
  puVar1 = (uint32_t *)WebPSafeMalloc((long)size,4);
  p->offset_length = puVar1;
  if (puVar1 != (uint32_t *)0x0) {
    p->size = size;
  }
  return (uint)(puVar1 != (uint32_t *)0x0);
}

Assistant:

int VP8LHashChainInit(VP8LHashChain* const p, int size) {
  assert(p->size == 0);
  assert(p->offset_length == NULL);
  assert(size > 0);
  p->offset_length =
      (uint32_t*)WebPSafeMalloc(size, sizeof(*p->offset_length));
  if (p->offset_length == NULL) return 0;
  p->size = size;

  return 1;
}